

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex9.cpp
# Opt level: O0

void func_arr(void)

{
  void *pvVar1;
  ostream *poVar2;
  uint local_20;
  uint local_1c;
  int i_1;
  int i;
  int *arr;
  uint size;
  
  pvVar1 = operator_new__(400);
  for (local_1c = 0; local_1c < 100; local_1c = local_1c + 1) {
    *(uint *)((long)pvVar1 + (long)(int)local_1c * 4) = local_1c;
  }
  std::operator<<((ostream *)&std::cout,"\nMemory addresses in array:");
  for (local_20 = 0; local_20 < 100; local_20 = local_20 + 10) {
    poVar2 = std::operator<<((ostream *)&std::cout,"\n&arr[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
    poVar2 = std::operator<<(poVar2,"] = ");
    std::ostream::operator<<(poVar2,(void *)((long)pvVar1 + (long)(int)local_20 * 4));
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  if (pvVar1 != (void *)0x0) {
    operator_delete__(pvVar1);
  }
  return;
}

Assistant:

void func_arr()
{
	constexpr unsigned int size = 100;
	int* arr = new int[size];
	for (int i = 0; i < size; i++)
	{
		arr[i] = i;
	}
	std::cout << "\nMemory addresses in array:";
	for (int i = 0; i < size; i += 10)
	{
		std::cout << "\n&arr[" << i << "] = " << &arr[i];
	}
	std::cout << std::endl;
	delete[] arr;
}